

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cpp
# Opt level: O0

void __thiscall Generator::registerPropertyStrings(Generator *this)

{
  bool bVar1;
  const_iterator o;
  Generator *in_RDI;
  long in_FS_OFFSET;
  PropertyDef *p;
  add_const_t<QList<PropertyDef>_> *__range1;
  const_iterator __end1;
  const_iterator __begin1;
  QByteArray *in_stack_ffffffffffffffb8;
  const_iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10.i = (PropertyDef *)&DAT_aaaaaaaaaaaaaaaa;
  local_10 = QList<PropertyDef>::begin((QList<PropertyDef> *)in_RDI);
  o = QList<PropertyDef>::end((QList<PropertyDef> *)in_RDI);
  while( true ) {
    bVar1 = QList<PropertyDef>::const_iterator::operator!=(&local_10,o);
    if (!bVar1) break;
    QList<PropertyDef>::const_iterator::operator*(&local_10);
    strreg(in_RDI,in_stack_ffffffffffffffb8);
    bVar1 = isBuiltinType(in_stack_ffffffffffffffb8);
    if (!bVar1) {
      strreg(in_RDI,in_stack_ffffffffffffffb8);
    }
    QList<PropertyDef>::const_iterator::operator++(&local_10);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Generator::registerPropertyStrings()
{
    for (const PropertyDef &p : std::as_const(cdef->propertyList)) {
        strreg(p.name);
        if (!isBuiltinType(p.type))
            strreg(p.type);
    }
}